

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-custom-filter.cc
# Opt level: O0

void process(char *infilename,char *outfilename,bool decode_specialized)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  bool bVar1;
  byte bVar2;
  StreamReplacer *this_00;
  ostream *poVar3;
  QPDFWriter local_b8 [8];
  QPDFWriter w;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_a8;
  QPDFObjectHandle local_98;
  QPDFObjectHandle *local_88;
  QPDFObjectHandle *o;
  iterator __end1;
  iterator __begin1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> p;
  StreamReplacer *replacer;
  QPDF local_28 [8];
  QPDF qpdf;
  bool decode_specialized_local;
  char *outfilename_local;
  char *infilename_local;
  
  QPDF::QPDF(local_28);
  QPDF::processFile((char *)local_28,infilename);
  this_00 = (StreamReplacer *)operator_new(0x78);
  StreamReplacer::StreamReplacer(this_00,local_28);
  p.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr<StreamReplacer,void>
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&__range1,this_00);
  QPDF::getAllObjects();
  __end1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin1);
  o = (QPDFObjectHandle *)
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                     *)&o), bVar1) {
    local_88 = __gnu_cxx::
               __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
               ::operator*(&__end1);
    bVar2 = QPDFObjectHandle::isStream();
    this = p.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount;
    if ((bVar2 & 1) != 0) {
      QPDFObjectHandle::QPDFObjectHandle(&local_98,local_88);
      std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr
                (&local_a8,(shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&__range1);
      StreamReplacer::registerStream((StreamReplacer *)this._M_pi,&local_98,&local_a8);
      std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr(&local_a8);
      QPDFObjectHandle::~QPDFObjectHandle(&local_98);
    }
    __gnu_cxx::
    __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin1);
  QPDFWriter::QPDFWriter(local_b8,local_28,outfilename);
  if (decode_specialized) {
    QPDFWriter::setDecodeLevel((qpdf_stream_decode_level_e)local_b8);
  }
  QPDFWriter::setStaticID(SUB81(local_b8,0));
  QPDFWriter::write();
  poVar3 = std::operator<<((ostream *)&std::cout,whoami);
  poVar3 = std::operator<<(poVar3,": new file written to ");
  poVar3 = std::operator<<(poVar3,outfilename);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  QPDFWriter::~QPDFWriter(local_b8);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&__range1);
  QPDF::~QPDF(local_28);
  return;
}

Assistant:

static void
process(char const* infilename, char const* outfilename, bool decode_specialized)
{
    QPDF qpdf;
    qpdf.processFile(infilename);

    // Create a single StreamReplacer instance. The interface requires a std::shared_ptr in various
    // places, so allocate a StreamReplacer and stash it in a std::shared_ptr.
    auto* replacer = new StreamReplacer(&qpdf);
    std::shared_ptr<QPDFObjectHandle::StreamDataProvider> p(replacer);

    for (auto& o: qpdf.getAllObjects()) {
        if (o.isStream()) {
            // Call registerStream for every stream. Only ones that registerStream decides to
            // replace will actually be replaced.
            replacer->registerStream(o, p);
        }
    }

    QPDFWriter w(qpdf, outfilename);
    if (decode_specialized) {
        w.setDecodeLevel(qpdf_dl_specialized);
    }
    // For the test suite, use static IDs.
    w.setStaticID(true); // for testing only
    w.write();
    std::cout << whoami << ": new file written to " << outfilename << std::endl;
}